

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QRect __thiscall
QTreeViewPrivate::visualRect(QTreeViewPrivate *this,QModelIndex *index,RectRule rule)

{
  char cVar1;
  uint item;
  uint uVar2;
  int iVar3;
  int iVar4;
  LayoutDirection LVar5;
  uint uVar6;
  QWidget *pQVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  QRect QVar13;
  
  uVar10 = 0xffffffff00000000;
  uVar9 = 0xffffffff;
  if (((-1 < index->r) && (-1 < index->c)) &&
     ((index->m).ptr == (this->super_QAbstractItemViewPrivate).model)) {
    pQVar7 = *(QWidget **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    cVar1 = (**(code **)(*(long *)pQVar7 + 0x2c0))(pQVar7,index);
    if ((rule == FullRow) || (cVar1 == '\0')) {
      if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate)
        ;
        (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      item = viewIndex(this,index);
      uVar11 = 0;
      uVar2 = 0;
      if ((int)item < 0) {
        uVar12 = 0;
      }
      else {
        uVar10 = (ulong)item;
        uVar9 = *(ulong *)&(this->viewItems).d.ptr[uVar10].field_0x1c;
        iVar8 = index->c;
        if ((uVar9 & 2) == 0) {
          uVar2 = QHeaderView::sectionViewportPosition
                            (*(QHeaderView **)(*(long *)&pQVar7->field_0x8 + 0x590),iVar8);
        }
        if ((uVar9 & 2) == 0) {
          iVar3 = QHeaderView::sectionSize
                            (*(QHeaderView **)(*(long *)&pQVar7->field_0x8 + 0x590),iVar8);
        }
        else {
          iVar3 = QHeaderView::length(this->header);
        }
        iVar4 = this->treePosition;
        if (iVar4 < 0) {
          iVar4 = QHeaderView::logicalIndex(this->header,0);
        }
        if (rule == FullRow) {
          pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)pQVar7);
          iVar3 = ((pQVar7->data->crect).x2.m_i - (pQVar7->data->crect).x1.m_i) + 1;
          uVar2 = 0;
        }
        else if (iVar4 == iVar8 && (rule == SingleSection || 0 < iVar8)) {
          iVar8 = 0;
          if (uVar10 < (ulong)(this->viewItems).d.size) {
            iVar8 = ((uint)this->rootDecoration +
                    (uint)*(ushort *)&(this->viewItems).d.ptr[uVar10].field_0x20) * this->indent;
          }
          iVar3 = iVar3 - iVar8;
          LVar5 = QWidget::layoutDirection(pQVar7);
          iVar4 = 0;
          if (LVar5 != RightToLeft) {
            iVar4 = iVar8;
          }
          uVar2 = iVar4 + uVar2;
        }
        uVar6 = coordinateForItem(this,item);
        iVar8 = itemHeight(this,item);
        uVar9 = (ulong)((uVar2 + iVar3) - 1);
        uVar12 = (ulong)uVar6 << 0x20;
        uVar11 = (ulong)uVar2;
        uVar10 = (ulong)((uVar6 + iVar8) - 1) << 0x20;
      }
      goto LAB_005aae5e;
    }
  }
  uVar12 = 0;
  uVar11 = 0;
LAB_005aae5e:
  QVar13.x2.m_i = (int)(uVar10 | uVar9);
  QVar13.y2.m_i = (int)((uVar10 | uVar9) >> 0x20);
  QVar13.x1.m_i = (int)(uVar12 | uVar11);
  QVar13.y1.m_i = (int)((uVar12 | uVar11) >> 0x20);
  return QVar13;
}

Assistant:

QRect QTreeViewPrivate::visualRect(const QModelIndex &index, RectRule rule) const
{
    Q_Q(const QTreeView);

    if (!isIndexValid(index))
        return QRect();

    // Calculate the entire row's rectangle, even if one of the elements is hidden
    if (q->isIndexHidden(index) && rule != FullRow)
        return QRect();

    executePostedLayout();

    const int viewIndex = this->viewIndex(index);
    if (viewIndex < 0)
        return QRect();

    const bool spanning = viewItems.at(viewIndex).spanning;
    const int column = index.column();

    // if we have a spanning item, make the selection stretch from left to right
    int x = (spanning ? 0 : q->columnViewportPosition(column));
    int width = (spanning ? header->length() : q->columnWidth(column));

    const bool addIndentation = isTreePosition(column) && (column > 0 || rule == SingleSection);

    if (rule == FullRow) {
        x = 0;
        width = q->viewport()->width();
    } else if (addIndentation) {
        // calculate indentation
        const int indentation = indentationForItem(viewIndex);
        width -= indentation;
        if (!q->isRightToLeft())
            x += indentation;
    }

    const int y = coordinateForItem(viewIndex);
    const int height = itemHeight(viewIndex);

    return QRect(x, y, width, height);
}